

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintStamp.cpp
# Opt level: O1

void __thiscall OpenMD::ConstraintStamp::~ConstraintStamp(ConstraintStamp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ConstraintStamp_00300f78;
  (this->PrintConstraintForce).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fe298;
  pcVar2 = (this->PrintConstraintForce).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->PrintConstraintForce).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->ConstrainedDistance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fe298;
  pcVar2 = (this->ConstrainedDistance).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ConstrainedDistance).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__DataHolder_002fd780;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).deprecatedKeywords_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).parameters_._M_t);
  return;
}

Assistant:

ConstraintStamp::~ConstraintStamp() {}